

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O2

void pzshape::TPZShapeDisc::Legendre
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  int num;
  double dVar1;
  double *pdVar2;
  long row;
  ulong uVar3;
  ulong uVar4;
  ulong col;
  bool bVar5;
  double dVar6;
  REAL val;
  
  num = degree + 1;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)num,1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,(long)n,(long)num);
  TPZShapeLinear::Legendre((x - x0) / C,num,phi,dphi,n);
  col = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = col;
  }
  for (; (long)col <= (long)degree; col = col + 1) {
    row = 0;
    uVar4 = uVar3;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      pdVar2 = TPZFMatrix<double>::operator()(dphi,row,col);
      dVar1 = *pdVar2;
      dVar6 = pow(C,(double)(int)(row + 1));
      val = dVar1 / dVar6;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,row,col,&val);
      row = row + 1;
    }
  }
  return;
}

Assistant:

void TPZShapeDisc::Legendre(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif

   x = (x - x0) / C;
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);

   TPZShapeLinear::Legendre(x, degree+1, phi, dphi, n);

   REAL val;
   for(int ord = 0; ord < degree+1; ord++)
      for (int ideriv = 0; ideriv < n; ideriv++){
	 val = dphi(ideriv, ord) / pow(C, ideriv+1);
	 dphi.Put(ideriv, ord, val);
      }

}